

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

void clear_slots_impl(MppBufSlotsImpl *impl)

{
  Mutex *this;
  int iVar1;
  int local_1c;
  MppBufSlotEntry *pMStack_18;
  RK_S32 i;
  MppBufSlotEntry *slot;
  MppBufSlotsImpl *impl_local;
  
  pMStack_18 = impl->slots;
  local_1c = 0;
  while( true ) {
    if (3 < local_1c) {
      local_1c = 0;
      while( true ) {
        if (impl->buf_count <= local_1c) {
          impl->used_count = 0;
          if (impl->info != (MppFrame)0x0) {
            mpp_frame_deinit(&impl->info);
          }
          if (impl->info_set != (MppFrame)0x0) {
            mpp_frame_deinit(&impl->info_set);
          }
          if (impl->logs != (MppBufSlotLogs *)0x0) {
            buf_slot_logs_deinit(impl->logs);
            impl->logs = (MppBufSlotLogs *)0x0;
          }
          if ((impl->lock != (Mutex *)0x0) && (this = impl->lock, this != (Mutex *)0x0)) {
            Mutex::~Mutex(this);
            operator_delete(this,0x28);
          }
          mpp_osal_free("clear_slots_impl",impl->slots);
          mpp_osal_free("clear_slots_impl",impl);
          return;
        }
        if ((((pMStack_18->status).val & 1) != 0) &&
           (_mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "!slot->status.on_used","clear_slots_impl",0x31e),
           (mpp_debug & 0x10000000) != 0)) break;
        if (((pMStack_18->status).val & 1) != 0) {
          _dump_slots("clear_slots_impl",impl);
          mpp_buf_slot_reset(impl,local_1c);
        }
        local_1c = local_1c + 1;
        pMStack_18 = pMStack_18 + 1;
      }
      abort();
    }
    iVar1 = list_empty(impl->queue + local_1c);
    if (iVar1 == 0) {
      _dump_slots("clear_slots_impl",impl);
    }
    iVar1 = list_empty(impl->queue + local_1c);
    if ((iVar1 == 0) &&
       (_mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "list_empty(&impl->queue[i])","clear_slots_impl",0x31a),
       (mpp_debug & 0x10000000) != 0)) break;
    local_1c = local_1c + 1;
  }
  abort();
}

Assistant:

static void clear_slots_impl(MppBufSlotsImpl *impl)
{
    MppBufSlotEntry *slot = (MppBufSlotEntry *)impl->slots;
    RK_S32 i;

    for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(impl->queue); i++) {
        if (!list_empty(&impl->queue[i]))
            dump_slots(impl);

        mpp_assert(list_empty(&impl->queue[i]));
    }

    for (i = 0; i < impl->buf_count; i++, slot++) {
        mpp_assert(!slot->status.on_used);
        if (slot->status.on_used) {
            dump_slots(impl);
            mpp_buf_slot_reset(impl, i);
        }
    }

    impl->used_count = 0;

    if (impl->info)
        mpp_frame_deinit(&impl->info);

    if (impl->info_set)
        mpp_frame_deinit(&impl->info_set);

    if (impl->logs) {
        buf_slot_logs_deinit(impl->logs);
        impl->logs = NULL;
    }

    if (impl->lock)
        delete impl->lock;

    mpp_free(impl->slots);
    mpp_free(impl);
}